

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O1

time_t time2sub(tm *tmp,_func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp,state *sp,
               int_fast32_t offset,_Bool *okayp,_Bool do_norm_secs)

{
  undefined8 uVar1;
  _Bool _Var2;
  int_fast32_t l;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  tm *ptVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  uint uVar11;
  undefined3 in_register_00000089;
  int_fast32_t l_1;
  int *piVar12;
  long lVar13;
  uchar *puVar14;
  bool bVar15;
  time_t t;
  tm yourtm;
  time_t newt;
  tm mytm;
  int *local_d0;
  tm local_c8;
  int_fast32_t local_9c;
  ttinfo *local_98;
  _func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *local_90;
  int *local_88;
  uint local_7c;
  ttinfo *local_78;
  tm local_6c;
  uchar *local_48;
  long local_40;
  long local_38;
  
  *okayp = false;
  local_c8.tm_isdst = tmp->tm_isdst;
  local_c8.tm_sec = tmp->tm_sec;
  local_c8.tm_min = tmp->tm_min;
  local_c8.tm_hour = tmp->tm_hour;
  local_c8.tm_mday = tmp->tm_mday;
  local_c8.tm_mon = tmp->tm_mon;
  local_c8.tm_year = tmp->tm_year;
  local_c8.tm_wday = tmp->tm_wday;
  local_c8.tm_yday = tmp->tm_yday;
  if (CONCAT31(in_register_00000089,do_norm_secs) != 0) {
    if (local_c8.tm_sec < 0) {
      uVar11 = ~((uint)~local_c8.tm_sec / 0x3c);
    }
    else {
      uVar11 = (uint)local_c8.tm_sec / 0x3c;
    }
    local_c8.tm_sec = uVar11 * -0x3c + local_c8.tm_sec;
    _Var2 = _PDCLIB_increment_overflow(&local_c8.tm_min,uVar11);
    if (_Var2) {
      return -1;
    }
  }
  if ((long)local_c8._0_8_ < 0) {
    uVar11 = ~((uint)~local_c8.tm_min / 0x3c);
  }
  else {
    uVar11 = (uint)local_c8.tm_min / 0x3c;
  }
  local_c8.tm_min = uVar11 * -0x3c + local_c8.tm_min;
  _Var2 = _PDCLIB_increment_overflow(&local_c8.tm_hour,uVar11);
  if (_Var2) {
    return -1;
  }
  if (local_c8.tm_hour < 0) {
    uVar11 = ~((uint)~local_c8.tm_hour / 0x18);
  }
  else {
    uVar11 = (uint)local_c8.tm_hour / 0x18;
  }
  local_c8.tm_hour = local_c8.tm_hour + uVar11 * -0x18;
  _Var2 = _PDCLIB_increment_overflow(&local_c8.tm_mday,uVar11);
  uVar1 = local_c8._16_8_;
  if (_Var2) {
    return -1;
  }
  if (local_c8.tm_mon < 0) {
    uVar11 = ~((uint)~local_c8.tm_mon / 0xc);
  }
  else {
    uVar11 = (uint)local_c8.tm_mon / 0xc;
  }
  local_c8.tm_mon = local_c8.tm_mon + uVar11 * -0xc;
  uVar3 = local_c8.tm_year;
  if ((long)uVar1 < 0) {
    bVar15 = true;
    if ((int)uVar11 < -0x80000000 - local_c8.tm_year) goto LAB_00113a31;
  }
  else {
    bVar15 = true;
    if ((int)(local_c8.tm_year ^ 0x7fffffffU) < (int)uVar11) goto LAB_00113a31;
  }
  bVar15 = false;
  uVar3 = uVar11 + local_c8.tm_year;
LAB_00113a31:
  if ((!bVar15) && ((int)uVar3 < 0x7ffff894)) {
    iVar4 = uVar3 + 0x76c;
    iVar5 = iVar4;
    local_9c = offset;
    local_90 = funcp;
    if (local_c8.tm_mday < 1) {
      do {
        iVar4 = iVar5 + -1;
        iVar5 = _PDCLIB_is_leap(iVar5 + (uint)(1 < local_c8.tm_mon) + -1);
        bVar15 = SCARRY4(local_c8.tm_mday,year_lengths[iVar5]);
        local_c8.tm_mday = local_c8.tm_mday + year_lengths[iVar5];
        iVar5 = iVar4;
      } while (local_c8.tm_mday == 0 || bVar15 != local_c8.tm_mday < 0);
    }
    do {
      if (local_c8.tm_mday < 0x16f) {
        iVar5 = _PDCLIB_is_leap(iVar4);
        while (mon_lengths[iVar5][local_c8.tm_mon] < local_c8.tm_mday) {
          local_c8.tm_mday = local_c8.tm_mday - mon_lengths[iVar5][local_c8.tm_mon];
          bVar15 = 10 < local_c8.tm_mon;
          local_c8.tm_mon = local_c8.tm_mon + 1;
          if (bVar15) {
            local_c8.tm_mon = 0;
            bVar15 = iVar4 == 0x7fffffff;
            iVar4 = iVar4 + 1;
            if (bVar15) {
              return -1;
            }
          }
          iVar5 = _PDCLIB_is_leap(iVar4);
        }
        if (iVar4 < -0x7ffff894) {
          return -1;
        }
        local_c8.tm_year = iVar4 + -0x76c;
        iVar5 = local_c8.tm_sec;
        local_7c = 0;
        if (0x3b < (uint)local_c8.tm_sec) {
          if (iVar4 + -0x76c < 0x46) {
            _Var2 = _PDCLIB_increment_overflow(&local_c8.tm_sec,-0x3b);
            if (_Var2) {
              return -1;
            }
            local_7c = local_c8.tm_sec;
            local_c8.tm_sec = 0x3b;
          }
          else {
            local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
            local_7c = iVar5;
          }
        }
        local_98 = (ttinfo *)0x8000000000000000;
        piVar9 = (int *)0x7fffffffffffffff;
        piVar12 = (int *)0x8000000000000000;
        do {
          piVar6 = (int *)((long)piVar9 / 2 + (long)piVar12 / 2);
          local_d0 = piVar12;
          if (((long)piVar12 <= (long)piVar6) && (local_d0 = piVar6, (long)piVar9 < (long)piVar6)) {
            local_d0 = piVar9;
          }
          ptVar7 = (*local_90)(sp,(time_t *)&local_d0,local_9c,&local_6c);
          if (ptVar7 == (tm *)0x0) {
            bVar15 = 0 < (long)local_d0;
LAB_00113c73:
            iVar4 = (uint)bVar15 * 2 + -1;
          }
          else {
            if (local_6c.tm_year != local_c8.tm_year) {
              bVar15 = local_c8.tm_year <= local_6c.tm_year;
              goto LAB_00113c73;
            }
            iVar4 = local_6c.tm_mon - local_c8.tm_mon;
            if (((iVar4 == 0) && (iVar4 = local_6c.tm_mday - local_c8.tm_mday, iVar4 == 0)) &&
               (iVar4 = local_6c.tm_hour - local_c8.tm_hour, iVar4 == 0)) {
              iVar4 = local_6c.tm_min - local_c8.tm_min;
              if (iVar4 == 0) {
                iVar4 = local_6c.tm_sec - local_c8.tm_sec;
              }
            }
          }
          if (iVar4 == 0) {
            if ((local_c8.tm_isdst < 0) || (local_6c.tm_isdst == local_c8.tm_isdst)) {
LAB_00113cf1:
              local_d0 = (int *)((long)(int)local_7c + (long)local_d0);
              local_88 = local_d0;
              ptVar7 = (*local_90)(sp,(time_t *)&local_d0,local_9c,tmp);
              if (ptVar7 == (tm *)0x0) {
                return (time_t)local_d0;
              }
              *okayp = true;
              return (time_t)local_d0;
            }
            if (sp == (state *)0x0) {
              return -1;
            }
            local_38 = (long)sp->typecnt;
            if (local_38 < 1) {
              return -1;
            }
            local_78 = sp->ttis;
            local_48 = sp->types + 0x7c4;
            do {
              lVar8 = local_38 + -1;
              local_40 = local_38;
              if ((local_c8.tm_isdst == (uint)local_78[lVar8].isdst) &&
                 (lVar13 = (long)sp->typecnt, 0 < lVar13)) {
                local_98 = local_78 + lVar8;
                lVar10 = lVar13 + 1;
                puVar14 = local_48 + lVar13 * 0x10;
                local_38 = lVar8;
                do {
                  if (local_c8.tm_isdst != (uint)*puVar14) {
                    local_88 = (int *)((long)local_d0 +
                                      ((long)*(int *)(puVar14 + -4) - (long)local_98->utoff));
                    ptVar7 = (*local_90)(sp,(time_t *)&local_88,local_9c,&local_6c);
                    if (((ptVar7 != (tm *)0x0) && (iVar4 = tmcomp(&local_6c,&local_c8), iVar4 == 0))
                       && (local_6c.tm_isdst == local_c8.tm_isdst)) {
                      local_d0 = local_88;
                      goto LAB_00113cf1;
                    }
                  }
                  lVar10 = lVar10 + -1;
                  puVar14 = puVar14 + -0x10;
                  lVar8 = local_38;
                } while (1 < lVar10);
              }
              local_38 = lVar8;
              if (local_40 < 2) {
                return -1;
              }
            } while( true );
          }
          if (local_d0 == piVar12) {
            if (local_d0 == (int *)0x7fffffffffffffff) {
              return -1;
            }
            local_d0 = (int *)((long)local_d0 + 1);
            piVar6 = (int *)((long)piVar12 + 1);
          }
          else {
            piVar6 = piVar12;
            if (local_d0 == piVar9) {
              if ((ttinfo *)local_d0 == local_98) {
                return -1;
              }
              local_d0 = (int *)((long)local_d0 + -1);
              piVar9 = (int *)((long)piVar9 + -1);
            }
          }
          if ((long)piVar9 < (long)piVar6) {
            return -1;
          }
          piVar12 = local_d0;
          if (0 < iVar4) {
            piVar9 = local_d0;
            piVar12 = piVar6;
          }
        } while( true );
      }
      iVar5 = _PDCLIB_is_leap((uint)(1 < local_c8.tm_mon) + iVar4);
      local_c8.tm_mday = local_c8.tm_mday - year_lengths[iVar5];
      bVar15 = iVar4 != 0x7fffffff;
      iVar4 = iVar4 + 1;
    } while (bVar15);
  }
  return -1;
}

Assistant:

static time_t time2sub( struct tm * tmp, struct tm *(*funcp)( struct state const *, time_t const *, int_fast32_t, struct tm * ), struct state const * sp, const int_fast32_t offset, bool * okayp, bool do_norm_secs )
{
    int          dir;
    int          i, j;
    int          saved_seconds;
    int_fast32_t li;
    time_t       lo;
    time_t       hi;
    int_fast32_t y;
    time_t       newt;
    time_t       t;
    struct tm    yourtm, mytm;

    *okayp = false;
    yourtm = *tmp;

    if ( do_norm_secs )
    {
        if ( normalize_overflow( &yourtm.tm_min, &yourtm.tm_sec, SECSPERMIN ) )
        {
            return WRONG;
        }
    }

    if ( normalize_overflow( &yourtm.tm_hour, &yourtm.tm_min, MINSPERHOUR ) )
    {
        return WRONG;
    }

    if ( normalize_overflow( &yourtm.tm_mday, &yourtm.tm_hour, HOURSPERDAY ) )
    {
        return WRONG;
    }

    y = yourtm.tm_year;

    if ( normalize_overflow32( &y, &yourtm.tm_mon, MONSPERYEAR ) )
    {
        return WRONG;
    }

    /* Turn y into an actual year number for now.
       It is converted back to an offset from TM_YEAR_BASE later.
    */
    if ( increment_overflow32( &y, TM_YEAR_BASE ) )
    {
        return WRONG;
    }

    while ( yourtm.tm_mday <= 0 )
    {
        if ( increment_overflow32( &y, -1 ) )
        {
            return WRONG;
        }

        li = y + ( 1 < yourtm.tm_mon );
        yourtm.tm_mday += year_lengths[ _PDCLIB_is_leap( li ) ];
    }
    while ( yourtm.tm_mday > DAYSPERLYEAR )
    {
        li = y + ( 1 < yourtm.tm_mon );
        yourtm.tm_mday -= year_lengths[ _PDCLIB_is_leap( li ) ];

        if ( increment_overflow32( &y, 1 ) )
        {
            return WRONG;
        }
    }

    for ( ; ; )
    {
        i = mon_lengths[ _PDCLIB_is_leap( y ) ][ yourtm.tm_mon ];

        if ( yourtm.tm_mday <= i )
        {
            break;
        }

        yourtm.tm_mday -= i;

        if ( ++yourtm.tm_mon >= MONSPERYEAR )
        {
            yourtm.tm_mon = 0;

            if ( increment_overflow32( &y, 1 ) )
            {
                return WRONG;
            }
        }
    }

    if ( increment_overflow32( &y, -TM_YEAR_BASE ) )
    {
        return WRONG;
    }

    if ( ! ( _PDCLIB_INT_MIN <= y && y <= _PDCLIB_INT_MAX ) )
    {
        return WRONG;
    }

    yourtm.tm_year = y;

    if ( yourtm.tm_sec >= 0 && yourtm.tm_sec < SECSPERMIN )
    {
        saved_seconds = 0;
    }
    else if ( y + TM_YEAR_BASE < EPOCH_YEAR )
    {
        /* We can't set tm_sec to 0, because that might push the
           time below the minimum representable time.
           Set tm_sec to 59 instead.
           This assumes that the minimum representable time is
           not in the same minute that a leap second was deleted from,
           which is a safer assumption than using 58 would be.
        */
        if ( _PDCLIB_increment_overflow( &yourtm.tm_sec, 1 - SECSPERMIN ) )
        {
            return WRONG;
        }

        saved_seconds = yourtm.tm_sec;
        yourtm.tm_sec = SECSPERMIN - 1;
    }
    else
    {
        saved_seconds = yourtm.tm_sec;
        yourtm.tm_sec = 0;
    }

    /* Do a binary search (this works whatever time_t's type is). */
    lo = _PDCLIB_TIME_MIN;
    hi = _PDCLIB_TIME_MAX;

    for ( ; ; )
    {
        t = lo / 2 + hi / 2;

        if ( t < lo )
        {
            t = lo;
        }
        else if ( t > hi )
        {
            t = hi;
        }

        if ( ! funcp( sp, &t, offset, &mytm ) )
        {
            /* Assume that t is too extreme to be represented in
               a struct tm; arrange things so that it is less
               extreme on the next pass.
            */
            dir = ( t > 0 ) ? 1 : -1;
        }
        else
        {
            dir = tmcomp( &mytm, &yourtm );
        }

        if ( dir != 0 )
        {
            if ( t == lo )
            {
                if ( t == _PDCLIB_TIME_MAX )
                {
                    return WRONG;
                }

                ++t;
                ++lo;
            }
            else if ( t == hi )
            {
                if ( t == _PDCLIB_TIME_MIN )
                {
                    return WRONG;
                }

                --t;
                --hi;
            }

            if ( lo > hi )
            {
                return WRONG;
            }

            if ( dir > 0 )
            {
                hi = t;
            }
            else
            {
                lo = t;
            }

            continue;
        }

#if defined TM_GMTOFF && ! UNINIT_TRAP
        if ( mytm.TM_GMTOFF != yourtm.TM_GMTOFF
            && ( yourtm.TM_GMTOFF < 0
            ? ( -SECSPERDAY <= yourtm.TM_GMTOFF
               && ( mytm.TM_GMTOFF <=
                   ( SMALLEST ( _PDCLIB_INT_FAST32_MAX, _PDCLIB_LONG_MAX )
                + yourtm.TM_GMTOFF ) ) )
            : ( yourtm.TM_GMTOFF <= SECSPERDAY
               && ( ( BIGGEST ( _PDCLIB_INT_FAST32_MIN, _PDCLIB_LONG_MIN )
                + yourtm.TM_GMTOFF )
                   <= mytm.TM_GMTOFF ) ) ) )
        {
            /* MYTM matches YOURTM except with the wrong UT offset.
               YOURTM.TM_GMTOFF is plausible, so try it instead.
               It's OK if YOURTM.TM_GMTOFF contains uninitialized data,
               since the guess gets checked.
            */
            time_t altt = t;
            int_fast32_t diff = mytm.TM_GMTOFF - yourtm.TM_GMTOFF;

            if ( ! increment_overflow_time( &altt, diff ) )
            {
                struct tm alttm;
                if ( funcp( sp, &altt, offset, &alttm )
                    && alttm.tm_isdst == mytm.tm_isdst
                    && alttm.TM_GMTOFF == yourtm.TM_GMTOFF
                    && tmcomp( &alttm, &yourtm ) == 0 )
                {
                    t = altt;
                    mytm = alttm;
                }
            }
        }
#endif

        if ( yourtm.tm_isdst < 0 || mytm.tm_isdst == yourtm.tm_isdst )
        {
            break;
        }

        /* Right time, wrong type.
           Hunt for right time, right type.
           It's okay to guess wrong since the guess
           gets checked.
        */
        if ( sp == NULL )
        {
            return WRONG;
        }

        for ( i = sp->typecnt - 1; i >= 0; --i )
        {
            if ( sp->ttis[ i ].isdst != yourtm.tm_isdst )
            {
                continue;
            }

            for ( j = sp->typecnt - 1; j >= 0; --j )
            {
                if ( sp->ttis[ j ].isdst == yourtm.tm_isdst )
                {
                    continue;
                }

                newt = ( t + sp->ttis[ j ].utoff - sp->ttis[ i ].utoff );

                if ( ! funcp( sp, &newt, offset, &mytm ) )
                {
                    continue;
                }

                if ( tmcomp( &mytm, &yourtm ) != 0 )
                {
                    continue;
                }

                if ( mytm.tm_isdst != yourtm.tm_isdst )
                {
                    continue;
                }

                /* We have a match. */
                t = newt;
                goto label;
            }
        }

        return WRONG;
    }

label:
    newt = t + saved_seconds;

    if ( ( newt < t ) != ( saved_seconds < 0 ) )
    {
        return WRONG;
    }

    t = newt;

    if ( funcp( sp, &t, offset, tmp ) )
    {
        *okayp = true;
    }

    return t;
}